

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O1

void __thiscall
Catch::AssertionInfo::AssertionInfo
          (AssertionInfo *this,string *_macroName,SourceLineInfo *_lineInfo,
          string *_capturedExpression,Flags _resultDisposition)

{
  pointer pcVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  (this->macroName)._M_dataplus._M_p = (pointer)&(this->macroName).field_2;
  pcVar1 = (_macroName->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)this,pcVar1,pcVar1 + _macroName->_M_string_length);
  (this->lineInfo).file._M_dataplus._M_p = (pointer)&(this->lineInfo).file.field_2;
  pcVar1 = (_lineInfo->file)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->lineInfo,pcVar1,pcVar1 + (_lineInfo->file)._M_string_length);
  (this->lineInfo).line = _lineInfo->line;
  (this->capturedExpression)._M_dataplus._M_p = (pointer)&(this->capturedExpression).field_2;
  pcVar1 = (_capturedExpression->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->capturedExpression,pcVar1,
             pcVar1 + _capturedExpression->_M_string_length);
  this->resultDisposition = _resultDisposition;
  if ((_resultDisposition & NegateResult) != Normal) {
    std::operator+(&local_50,"!",_capturedExpression);
    std::__cxx11::string::operator=((string *)&this->capturedExpression,(string *)&local_50);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
    }
  }
  return;
}

Assistant:

AssertionInfo::AssertionInfo(   const std::string& _macroName,
                                    const SourceLineInfo& _lineInfo,
                                    const std::string& _capturedExpression,
                                    ResultDisposition::Flags _resultDisposition )
    :   macroName( _macroName ),
        lineInfo( _lineInfo ),
        capturedExpression( _capturedExpression ),
        resultDisposition( _resultDisposition )
    {
        if( shouldNegate( resultDisposition ) )
            capturedExpression = "!" + _capturedExpression;
    }